

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

void __thiscall
pfederc::StringToken::StringToken
          (StringToken *this,Token *last,TokenType type,Position *pos,string *str)

{
  size_t sVar1;
  
  (this->super_Token).last = last;
  (this->super_Token).type = type;
  sVar1 = pos->startIndex;
  (this->super_Token).pos.line = pos->line;
  (this->super_Token).pos.startIndex = sVar1;
  (this->super_Token).pos.endIndex = pos->endIndex;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__StringToken_00128660;
  std::__cxx11::string::string((string *)&this->str,(string *)str);
  return;
}

Assistant:

StringToken::StringToken(Token *last, TokenType type, const Position &pos,
            const std::string &str) noexcept
    : Token(last, type, pos), str(str) {
}